

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuilder.c
# Opt level: O0

strbuilder * strbuilder_append_string(strbuilder *builder,char *str)

{
  size_t sVar1;
  size_t old_size;
  char *curr;
  char *str_local;
  strbuilder *builder_local;
  
  old_size = (size_t)str;
  if (builder == (strbuilder *)0x0) {
    builder_local = (strbuilder *)0x0;
  }
  else {
    for (; builder_local = builder, *(char *)old_size != '\0'; old_size = old_size + 1) {
      if ((builder->position == builder->buffer_end) && (sVar1 = increase_size(builder), sVar1 == 0)
         ) {
        return (strbuilder *)0x0;
      }
      *builder->position = *(char *)old_size;
      builder->position = builder->position + 1;
    }
  }
  return builder_local;
}

Assistant:

struct strbuilder *
strbuilder_append_string( struct strbuilder *builder, const char *str ) {
  const char *curr;
  size_t old_size;

  if( !builder ) {
    return NULL;
  }

  curr = str;
  while ( *curr != '\0' ) {
    if( builder->position == builder->buffer_end ) {
      old_size = increase_size( builder );
      if( old_size == 0 ) {
        return NULL;
      }
    }

    *( builder->position ) = *curr;
    builder->position++;

    curr++;
  }

  return builder;
}